

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_remotes.hpp
# Opt level: O2

void __thiscall Omega_h::Remotes::~Remotes(Remotes *this)

{
  Write<int>::~Write((Write<int> *)(this + 0x10));
  Write<int>::~Write((Write<int> *)this);
  return;
}

Assistant:

Remotes() {}